

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

boolean get_sof(j_decompress_ptr cinfo,boolean is_baseline,boolean is_prog,boolean is_arith)

{
  JOCTET JVar1;
  JOCTET JVar2;
  byte bVar3;
  jpeg_source_mgr *pjVar4;
  jpeg_error_mgr *pjVar5;
  boolean bVar6;
  JDIMENSION JVar7;
  int iVar8;
  jpeg_component_info *pjVar9;
  uint uVar10;
  JOCTET *pJVar11;
  byte *pbVar12;
  size_t sVar13;
  int *piVar14;
  
  pjVar4 = cinfo->src;
  pJVar11 = pjVar4->next_input_byte;
  sVar13 = pjVar4->bytes_in_buffer;
  cinfo->is_baseline = is_baseline;
  cinfo->progressive_mode = is_prog;
  cinfo->arith_code = is_arith;
  if (sVar13 == 0) {
    bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
    if (bVar6 != 0) {
      pJVar11 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
      goto LAB_002773b1;
    }
LAB_0027769d:
    bVar6 = 0;
  }
  else {
LAB_002773b1:
    JVar1 = *pJVar11;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pJVar11 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
    }
    else {
      pJVar11 = pJVar11 + 1;
    }
    JVar2 = *pJVar11;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
    }
    else {
      pbVar12 = pJVar11 + 1;
    }
    cinfo->data_precision = (uint)*pbVar12;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    JVar7 = (uint)*pbVar12 << 8;
    cinfo->image_height = JVar7;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
      JVar7 = cinfo->image_height;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    cinfo->image_height = *pbVar12 + JVar7;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    JVar7 = (uint)*pbVar12 << 8;
    cinfo->image_width = JVar7;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
      JVar7 = cinfo->image_width;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    cinfo->image_width = *pbVar12 + JVar7;
    sVar13 = sVar13 - 1;
    if (sVar13 == 0) {
      bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_0027769d;
      pbVar12 = pjVar4->next_input_byte;
      sVar13 = pjVar4->bytes_in_buffer;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    cinfo->num_components = (uint)*pbVar12;
    pjVar5 = cinfo->err;
    (pjVar5->msg_parm).i[0] = cinfo->unread_marker;
    (pjVar5->msg_parm).i[1] = cinfo->image_width;
    (pjVar5->msg_parm).i[2] = cinfo->image_height;
    (pjVar5->msg_parm).i[3] = cinfo->num_components;
    pjVar5->msg_code = 0x66;
    (*pjVar5->emit_message)((j_common_ptr)cinfo,1);
    if (cinfo->marker->saw_SOF != 0) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x3c;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
    }
    if (((cinfo->image_height == 0) || (cinfo->image_width == 0)) ||
       (iVar8 = cinfo->num_components, iVar8 < 1)) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x21;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      iVar8 = cinfo->num_components;
    }
    if ((ulong)CONCAT11(JVar1,JVar2) - 8 != (long)(iVar8 * 3)) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0xc;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      iVar8 = cinfo->num_components;
    }
    pjVar9 = cinfo->comp_info;
    if (pjVar9 == (jpeg_component_info *)0x0) {
      pjVar9 = (jpeg_component_info *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)iVar8 * 0x60);
      cinfo->comp_info = pjVar9;
      iVar8 = cinfo->num_components;
    }
    pbVar12 = pbVar12 + 1;
    sVar13 = sVar13 - 1;
    if (0 < iVar8) {
      piVar14 = &pjVar9->quant_tbl_no;
      uVar10 = 0;
      do {
        piVar14[-3] = uVar10;
        if (sVar13 == 0) {
          bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
          if (bVar6 == 0) goto LAB_0027769d;
          pbVar12 = pjVar4->next_input_byte;
          sVar13 = pjVar4->bytes_in_buffer;
        }
        ((jpeg_component_info *)(piVar14 + -4))->component_id = (uint)*pbVar12;
        sVar13 = sVar13 - 1;
        if (sVar13 == 0) {
          bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
          if (bVar6 == 0) goto LAB_0027769d;
          pbVar12 = pjVar4->next_input_byte;
          sVar13 = pjVar4->bytes_in_buffer;
        }
        else {
          pbVar12 = pbVar12 + 1;
        }
        bVar3 = *pbVar12;
        piVar14[-2] = (uint)(bVar3 >> 4);
        piVar14[-1] = bVar3 & 0xf;
        sVar13 = sVar13 - 1;
        if (sVar13 == 0) {
          bVar6 = (*pjVar4->fill_input_buffer)(cinfo);
          if (bVar6 == 0) goto LAB_0027769d;
          pbVar12 = pjVar4->next_input_byte;
          sVar13 = pjVar4->bytes_in_buffer;
        }
        else {
          pbVar12 = pbVar12 + 1;
        }
        *piVar14 = (uint)*pbVar12;
        pjVar5 = cinfo->err;
        (pjVar5->msg_parm).i[0] = ((jpeg_component_info *)(piVar14 + -4))->component_id;
        (pjVar5->msg_parm).i[1] = piVar14[-2];
        (pjVar5->msg_parm).i[2] = piVar14[-1];
        (pjVar5->msg_parm).i[3] = *piVar14;
        pjVar5->msg_code = 0x67;
        (*pjVar5->emit_message)((j_common_ptr)cinfo,1);
        uVar10 = uVar10 + 1;
        pbVar12 = pbVar12 + 1;
        sVar13 = sVar13 - 1;
        piVar14 = piVar14 + 0x18;
      } while ((int)uVar10 < cinfo->num_components);
    }
    cinfo->marker->saw_SOF = 1;
    pjVar4->next_input_byte = pbVar12;
    pjVar4->bytes_in_buffer = sVar13;
    bVar6 = 1;
  }
  return bVar6;
}

Assistant:

LOCAL(boolean)
get_sof (j_decompress_ptr cinfo, boolean is_baseline, boolean is_prog,
	 boolean is_arith)
/* Process a SOFn marker */
{
  INT32 length;
  int c, ci;
  jpeg_component_info * compptr;
  INPUT_VARS(cinfo);

  cinfo->is_baseline = is_baseline;
  cinfo->progressive_mode = is_prog;
  cinfo->arith_code = is_arith;

  INPUT_2BYTES(cinfo, length, return FALSE);

  INPUT_BYTE(cinfo, cinfo->data_precision, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_height, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_width, return FALSE);
  INPUT_BYTE(cinfo, cinfo->num_components, return FALSE);

  length -= 8;

  TRACEMS4(cinfo, 1, JTRC_SOF, cinfo->unread_marker,
	   (int) cinfo->image_width, (int) cinfo->image_height,
	   cinfo->num_components);

  if (cinfo->marker->saw_SOF)
    ERREXIT(cinfo, JERR_SOF_DUPLICATE);

  /* We don't support files in which the image height is initially specified */
  /* as 0 and is later redefined by DNL.  As long as we have to check that,  */
  /* might as well have a general sanity check. */
  if (cinfo->image_height <= 0 || cinfo->image_width <= 0
      || cinfo->num_components <= 0)
    ERREXIT(cinfo, JERR_EMPTY_IMAGE);

  if (length != (cinfo->num_components * 3))
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  if (cinfo->comp_info == NULL)	/* do only once, even if suspend */
    cinfo->comp_info = (jpeg_component_info *) (*cinfo->mem->alloc_small)
			((j_common_ptr) cinfo, JPOOL_IMAGE,
			 cinfo->num_components * SIZEOF(jpeg_component_info));
  
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    compptr->component_index = ci;
    INPUT_BYTE(cinfo, compptr->component_id, return FALSE);
    INPUT_BYTE(cinfo, c, return FALSE);
    compptr->h_samp_factor = (c >> 4) & 15;
    compptr->v_samp_factor = (c     ) & 15;
    INPUT_BYTE(cinfo, compptr->quant_tbl_no, return FALSE);

    TRACEMS4(cinfo, 1, JTRC_SOF_COMPONENT,
	     compptr->component_id, compptr->h_samp_factor,
	     compptr->v_samp_factor, compptr->quant_tbl_no);
  }

  cinfo->marker->saw_SOF = TRUE;

  INPUT_SYNC(cinfo);
  return TRUE;
}